

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyServer.cpp
# Opt level: O0

void __thiscall ProxyServer::ProxyServer(ProxyServer *this)

{
  uint8_t *puVar1;
  ProxyServer *this_local;
  
  std::unique_ptr<net_uv::TCPClient,std::default_delete<net_uv::TCPClient>>::
  unique_ptr<std::default_delete<net_uv::TCPClient>,void>
            ((unique_ptr<net_uv::TCPClient,std::default_delete<net_uv::TCPClient>> *)this);
  std::unique_ptr<net_uv::Server,std::default_delete<net_uv::Server>>::
  unique_ptr<std::default_delete<net_uv::Server>,void>
            ((unique_ptr<net_uv::Server,std::default_delete<net_uv::Server>> *)&this->m_pipe);
  std::unique_ptr<Cypher,std::default_delete<Cypher>>::unique_ptr<std::default_delete<Cypher>,void>
            ((unique_ptr<Cypher,std::default_delete<Cypher>> *)&this->m_cypher);
  std::unique_ptr<DnsResolver,std::default_delete<DnsResolver>>::
  unique_ptr<std::default_delete<DnsResolver>,void>
            ((unique_ptr<DnsResolver,std::default_delete<DnsResolver>> *)&this->m_dnsResolver);
  this->m_runStatus = STOP;
  std::function<void_()>::function(&this->m_stopCall,(nullptr_t)0x0);
  net_uv::UVLoop::UVLoop(&this->m_loop);
  net_uv::UVTimer::UVTimer(&this->m_update);
  net_uv::UVTimer::UVTimer(&this->m_clsTimer);
  this->m_recvBuffer = (char *)0x0;
  this->m_recvBufLen = 0;
  std::
  unordered_map<unsigned_int,_ProxyServer::SessionData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ProxyServer::SessionData>_>_>
  ::unordered_map(&this->m_sessionDataMap);
  puVar1 = (uint8_t *)malloc(0x40000);
  this->m_sendBuffer = puVar1;
  return;
}

Assistant:

ProxyServer::ProxyServer()
	: m_stopCall(nullptr)
	, m_runStatus(RUN_STATUS::STOP)
	, m_recvBuffer(NULL)
	, m_recvBufLen(0)
{
	m_sendBuffer = (uint8_t*)fc_malloc(MSG_MAX_SIZE);
}